

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O2

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::measureDynamics
          (IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u,uint k)

{
  Index *pIVar1;
  Index *pIVar2;
  AlgebraicSensor *this_00;
  Index *pIVar3;
  LhsNested pMVar4;
  IMUElasticLocalFrameDynamicalSystem *pIVar5;
  IndexedMatrixArray *this_01;
  Matrix *pMVar6;
  Matrix3 *pMVar7;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_02;
  undefined4 in_register_0000000c;
  Vector *v;
  Matrix<double,_3,_3,_0,_3,_3> *x_00;
  Index extraout_RDX;
  uint i;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint in_R8D;
  ulong uVar12;
  uint uVar13;
  double *pdVar14;
  double dVar15;
  Vector VVar16;
  undefined1 local_278 [16];
  scalar_constant_op<double> local_268;
  variable_if_dynamic<long,__1> vStack_260;
  variable_if_dynamic<long,__1> local_258;
  double *local_250;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  uint uStack_23c;
  double *local_238;
  Index *local_230;
  uint local_224;
  Index *local_220;
  Index *local_218;
  Index *local_210;
  Index *local_208;
  IndexedMatrixArray *local_200;
  Index *local_1f8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1f0;
  Index *local_1e8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1e0;
  Index *local_1d8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1d0;
  Index *local_1c8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1c0;
  Index *local_1b8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1b0;
  IMUElasticLocalFrameDynamicalSystem *local_1a8;
  Index *local_1a0;
  Matrix3 *local_198;
  Index *local_190;
  Matrix<double,_3,_1,_0,_3,_1> *local_188;
  Index *local_180;
  Vector *local_178;
  IndexedMatrixArray *local_170;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_168;
  Scalar local_120;
  Scalar local_118;
  Scalar local_110;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
  *local_108;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  *local_100;
  Index *local_f0;
  Matrix<double,_3,_1,_0,_3,_1> *local_e8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_e0;
  double *local_b8;
  undefined4 local_b0;
  uint uStack_ac;
  undefined4 uStack_a8;
  uint uStack_a4;
  undefined8 local_a0;
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> local_98 [48];
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> local_68 [56];
  
  v = (Vector *)CONCAT44(in_register_0000000c,k);
  local_1a8 = this;
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  DynamicalSystemFunctorBase::assertInputVector_((DynamicalSystemFunctorBase *)x,v);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x[0x1a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,u);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x[0x1c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,v);
  *(uint *)&x[0x6f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = in_R8D;
  uVar13 = 0;
  local_224 = in_R8D;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,u,0,3);
  local_220 = (Index *)(x + 0x4a);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_220,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,u,6,3);
  local_180 = &x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_180,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,u,3,3);
  local_210 = &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_210,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,u,9,3);
  local_218 = (Index *)(x + 0x50);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_218,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  for (lVar9 = 0xc; lVar9 != 0x18; lVar9 = lVar9 + 6) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,u,lVar9,6)
    ;
    pMVar6 = IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 0xc1),uVar13);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (pMVar6,(Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278
              );
    uVar13 = uVar13 + 1;
  }
  local_170 = (IndexedMatrixArray *)(x + 0xc1);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,u,0x18,3);
  local_188 = (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0xcb);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (local_188,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,u,0x1b,3);
  local_190 = &x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_190,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  local_178 = u;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,u,0x20,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             &x[0x5d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278);
  pMVar7 = computeRotation_((IMUElasticLocalFrameDynamicalSystem *)x,(Vector3 *)local_210,0);
  local_230 = &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_230,pMVar7);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_6>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6> *)&local_168,v,9,6);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,6,1,false>>
            (local_68,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6,_1,_false>_>
                       *)&local_168);
  local_198 = (Matrix3 *)(x + 0xb8);
  kine::computeInertiaTensor((Matrix3 *)local_278,(Vector6 *)local_68,local_198);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_6>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6> *)&local_168,v,0x12,6);
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,6,1,false>>
            (local_98,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6,_1,_false>_>
                       *)&local_168);
  local_1a0 = &x[0xbc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  kine::computeInertiaTensor((Matrix3 *)local_278,(Vector6 *)local_98,(Matrix3 *)local_1a0);
  uVar13 = *(uint *)((long)&x[0x13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4);
  local_200 = (IndexedMatrixArray *)
              &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  uVar11 = 0x33;
  for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,
               (ulong)(uVar11 - 3),3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_168,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                *)local_278);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)(x + 0xa2),(Matrix *)&local_168,(uint)uVar12)
    ;
    free((void *)local_168.m_lhs.m_lhs._0_8_);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,
               (ulong)uVar11,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_168,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                *)local_278);
    IndexedMatrixArray::setValue(local_200,(Matrix *)&local_168,(uint)uVar12);
    free((void *)local_168.m_lhs.m_lhs._0_8_);
    uVar11 = uVar11 + 0xc;
  }
  uVar13 = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,0,3);
  pIVar1 = &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar1,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278);
  if (*(char *)((long)&x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 5) != '\0') {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pIVar1,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x53));
  }
  local_1b8 = pIVar1;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,3,3);
  local_1d0 = (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x90);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (local_1d0,(Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278
            );
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,6,3);
  local_1e8 = &x[0x91].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_1e8,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,0xf,3);
  local_1f0 = (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x93);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (local_1f0,(Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278
            );
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,0x18,3);
  local_1f8 = &x[0x94].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_1f8,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,v,0x1b,3);
  local_1b0 = (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x96);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (local_1b0,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,v,0x21,3);
  local_1d8 = &x[0x97].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_1d8,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,v,0x27,3);
  local_1e0 = (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x99);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (local_1e0,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,v,0x1e,3);
  pIVar1 = &x[0x9a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar1,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,v,0x24,3);
  local_1c0 = (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x9c);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (local_1c0,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
  pMVar7 = computeRotation_((IMUElasticLocalFrameDynamicalSystem *)x,(Vector3 *)pIVar1,1);
  pIVar1 = &x[0x9d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)pIVar1,pMVar7);
  local_278._0_8_ = local_230;
  local_1c8 = (Index *)(x + 0x86);
  local_278._8_8_ = pIVar1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_1c8,
             (Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
              *)local_278);
  this_01 = local_170;
  pIVar1 = &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_208 = &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
  for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 3) {
    pMVar6 = IndexedMatrixArray::operator[](this_01,uVar13);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)local_278,pMVar6,0,0)
    ;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_168,
               (Matrix<double,__1,_1,_0,__1,_1> *)pIVar1,lVar9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_168,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)local_278);
    pMVar6 = IndexedMatrixArray::operator[](this_01,uVar13);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)local_278,pMVar6,3,0)
    ;
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_168,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_208,lVar9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,3,1,false>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)&local_168,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *)local_278);
    uVar13 = uVar13 + 1;
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,0x2a,3);
  pIVar3 = &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar3,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,v,0x2d,3);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)(x + 0xf2),
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278);
  pIVar2 = local_230;
  (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[10]
  )(x,local_1b8,local_1d0,local_1e8,local_1f0,local_1f8,local_198,local_1a0,
    (IndexedMatrixArray *)(x + 0xa2),local_200,local_220,local_180,(LhsNested)(x + 0xce),local_210,
    local_230,local_218,
    &x[0xcf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,pIVar1,
    local_208,local_188,local_190,pIVar3,(Matrix<double,_3,_1,_0,_3,_1> *)(x + 0xf2));
  local_108 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
               *)CONCAT44(local_108._4_4_,2);
  local_250 = x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
  local_278._0_8_ = (LhsNested)0x0;
  pIVar1 = &x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_248 = (undefined4)*pIVar1;
  uStack_244 = *(undefined4 *)
                ((long)&x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows + 4);
  local_268.m_other = (double)(*pIVar1 ^ 0x8000000000000000);
  vStack_260.m_value =
       (ulong)x[0x51].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data ^ 0x8000000000000000;
  local_258.m_value = 0;
  uStack_240 = SUB84(local_250,0);
  uStack_23c = (uint)((ulong)local_250 >> 0x20) ^ 0x80000000;
  local_238 = (double *)0x0;
  Eigen::operator*(&local_e0,(int *)&local_108,(StorageBaseType *)local_278);
  local_168.m_lhs.m_rhs = (RhsNested)pIVar2;
  local_168.m_rhs = (RhsNested)local_1d8;
  pIVar1 = &x[0x8a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)pIVar1,&local_168);
  local_278._8_8_ = pIVar2;
  local_268.m_other = (double)local_1e0;
  local_278._0_8_ = (LhsNested)(x + 0xce);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pIVar1,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)local_278);
  local_250 = (double *)
              x[0xcf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
  local_278._0_8_ = (LhsNested)0x0;
  local_248 = *(undefined4 *)
               &x[0xd0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
  uStack_244 = *(undefined4 *)
                ((long)&x[0xd0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data + 4);
  local_268.m_other =
       (double)((ulong)x[0xd0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data ^ 0x8000000000000000);
  vStack_260.m_value =
       x[0xd0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ^
       0x8000000000000000;
  local_258.m_value = 0;
  uStack_240 = SUB84(local_250,0);
  uStack_23c = (uint)((ulong)local_250 >> 0x20) ^ 0x80000000;
  local_238 = (double *)0x0;
  local_b8 = x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  uStack_a8 = SUB84(local_b8,0);
  local_e0._0_8_ = 0;
  uStack_a4 = (uint)((ulong)local_b8 >> 0x20) ^ 0x80000000;
  local_e0.m_lhs.m_functor.m_other._0_4_ =
       (undefined4)
       x[0x50].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  uStack_ac = *(uint *)((long)&x[0x50].
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows + 4);
  local_e0.m_rhs._0_4_ =
       *(undefined4 *)
        &x[0x51].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_e0.m_lhs.m_functor.m_other._4_4_ = uStack_ac ^ 0x80000000;
  local_e0.m_rhs._4_4_ =
       *(uint *)((long)&x[0x51].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data + 4) ^ 0x80000000;
  local_e0._32_8_ = 0;
  local_a0 = 0;
  local_b0 = local_e0.m_lhs.m_functor.m_other._0_4_;
  tools::square<Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)&local_168,(tools *)&local_e0,x_00);
  local_f0 = pIVar2;
  local_e8 = local_1b0;
  local_108 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
               *)local_278;
  local_100 = &local_168;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)pIVar1,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_108);
  local_278._0_8_ = local_218;
  local_278._8_8_ = pIVar2;
  local_268.m_other = (double)local_1c0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x8c),
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)local_278);
  pIVar3 = &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  this_00 = (AlgebraicSensor *)(x + 1);
  uVar13 = AlgebraicSensor::getStateSize(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pIVar3,(ulong)uVar13);
  local_168.m_lhs.m_lhs._0_8_ = local_1c8;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<9>
            ((Type *)local_278,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pIVar3,9);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,9,1,false>,Eigen::Map<Eigen::Matrix<double,9,1,0,9,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_9,_1,_false> *)local_278,
             (Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_168);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,
             (Matrix<double,__1,_1,_0,__1,_1> *)pIVar3,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278,
             (Matrix<double,_3,_1,_0,_3,_1> *)pIVar1);
  uVar12 = 0xc;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,
             (Matrix<double,__1,_1,_0,__1,_1> *)pIVar3,0xc,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278,
             (Matrix<double,_3,_1,_0,_3,_1> *)(x + 0x8c));
  *(undefined4 *)
   &x[0x46].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0xf;
  if (*(char *)((long)&x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 4) == '\x01') {
    for (uVar10 = 0;
        uVar10 < *(uint *)((long)&x[0x13].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows + 4); uVar10 = uVar10 + 1) {
      Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_278,
                 local_178,uVar12 & 0xffffffff,6);
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_168,
                 (Matrix<double,__1,_1,_0,__1,_1> *)pIVar3,
                 (ulong)*(uint *)&x[0x46].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_data,6);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_168,
                 (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_278);
      *(int *)&x[0x46].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data =
           *(int *)&x[0x46].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_data + 6;
      uVar12 = uVar12 + 6;
    }
  }
  if (*(char *)((long)&x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows + 6) == '\x01') {
    pdVar14 = (double *)
              cos((double)x[0x5e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows);
    x[0x65].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar14;
    dVar15 = sin((double)x[0x5e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows);
    x[0x65].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar15;
    pIVar1 = &x[0x60].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    local_278._8_8_ = 0;
    local_268.m_other = 4.94065645841247e-324;
    vStack_260.m_value = 1;
    x[0x60].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)x[0x65].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data;
    local_168.m_lhs.m_lhs._0_8_ = -dVar15;
    local_278._0_8_ = pIVar1;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_278,
                        (Scalar *)&local_168);
    local_e0._0_8_ = 0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar8,(Scalar *)&local_e0);
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar8,(Scalar *)
                               &x[0x65].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar8,(Scalar *)(x + 0x65));
    local_108 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                 *)0x0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar8,(Scalar *)&local_108);
    local_110 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar8,&local_110);
    local_118 = 0.0;
    pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar8,&local_118);
    local_120 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar8,&local_120);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_278);
    local_278._8_8_ = local_230;
    pIVar2 = &x[0x79].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    local_278._0_8_ = pIVar1;
    local_168.m_lhs.m_lhs._0_8_ = pIVar2;
    Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_168,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)local_278);
    pMVar4 = (LhsNested)(x + 0x7e);
    local_278._8_8_ = 0;
    local_268.m_other = 4.94065645841247e-324;
    vStack_260.m_value = 1;
    x[0x7e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)
         x[0x5d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_278._0_8_ = pMVar4;
    this_02 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278,
                         (Scalar *)(x + 0x5e));
    local_168.m_lhs.m_lhs._0_8_ = 0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (this_02,(Scalar *)&local_168);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_278);
    local_278._8_8_ = local_220;
    local_278._0_8_ = pIVar1;
    local_168.m_lhs.m_lhs._0_8_ = pMVar4;
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_168,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)local_278);
    pIVar1 = &x[0x7f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    Eigen::AngleAxis<double>::operator=
              ((AngleAxis<double> *)pIVar1,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)pIVar2);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                      *)local_278,(double *)(x + 0x81),(StorageBaseType *)pIVar1);
    pIVar1 = &x[0x81].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    local_168.m_lhs.m_lhs._0_8_ = pIVar1;
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_168,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)local_278);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,
               (Matrix<double,__1,_1,_0,__1,_1> *)pIVar3,
               (ulong)*(uint *)&x[0x46].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278,
               (Matrix<double,_3,_1,_0,_3,_1> *)pMVar4);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_278,
               (Matrix<double,__1,_1,_0,__1,_1> *)pIVar3,
               (ulong)(*(int *)&x[0x46].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + 3),3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)local_278,
               (Matrix<double,_3,_1,_0,_3,_1> *)pIVar1);
  }
  AlgebraicSensor::setState(this_00,(Vector *)pIVar3,local_224);
  AlgebraicSensor::getMeasurements((AlgebraicSensor *)local_278,SUB81(this_00,0));
  pMVar4 = (LhsNested)
           x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_278._0_8_;
  pdVar14 = x[0x1c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  x[0x1c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)local_278._8_8_;
  local_278._0_8_ = pMVar4;
  local_278._8_8_ = pdVar14;
  free(pMVar4);
  pIVar5 = local_1a8;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_1a8,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  VVar16.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar16.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pIVar5;
  return (Vector)VVar16.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::measureDynamics
                (const Vector& x, const Vector& u, unsigned k)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        xk_fory_=x;
        uk_fory_=u;
        op_.k_fory=k;

        op_.positionFlex=x.segment(state::pos,3);
        op_.velocityFlex=x.segment(state::linVel,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.angularVelocityFlex=x.segment(state::angVel,3);

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts[i]=x.segment(state::fc+6*i,6);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        op_.drift=x.segment<3>(state::drift);

        op_.rFlex =computeRotation_(op_.orientationFlexV,0);

        kine::computeInertiaTensor(u.segment<6>(input::inertia),op_.inertia);
        kine::computeInertiaTensor(u.segment<6>(input::dotInertia),op_.dotInertia);
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            // Positions
            op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
            op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;
        op_.velocityCom=u.segment<3>(input::velCom);
        op_.accelerationCom=u.segment<3>(input::accCom);
        op_.AngMomentum=u.segment<3>(input::angMoment);
        op_.dotAngMomentum=u.segment<3>(input::dotAngMoment);

        op_.positionControl=u.segment(input::posIMU,3);
        op_.velocityControl=u.segment(input::linVelIMU,3);
        op_.accelerationControl=u.segment(input::linAccIMU,3);
        op_.orientationControlV=u.segment(input::oriIMU,3);
        op_.angularVelocityControl=u.segment(input::angVelIMU,3);

        op_.rControl=computeRotation_(op_.orientationControlV,1);

        op_.rimu = op_.rFlex * op_.rControl;

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        // Get acceleration
        computeAccelerations (op_.positionCom, op_.velocityCom,
                  op_.accelerationCom, op_.AngMomentum, op_.dotAngMomentum,
                  op_.inertia, op_.dotInertia,  op_.contactPosV, op_.contactOriV,
                  op_.positionFlex, op_.velocityFlex, op_.linearAcceleration,
                  op_.orientationFlexV, op_.rFlex, op_.angularVelocityFlex,
                  op_.angularAcceleration, fc_, tc_, op_.fm,op_.tm,
                  op_.addForce,op_.addMoment);

        // Translation sensor dynamic
        op_.imuAcc = 2*kine::skewSymmetric(op_.angularVelocityFlex) * op_.rFlex * op_.velocityControl;
        op_.imuAcc += op_.linearAcceleration + op_.rFlex * op_.accelerationControl;
        op_.imuAcc += (
                    kine::skewSymmetric(op_.angularAcceleration)
                    + tools::square(kine::skewSymmetric(op_.angularVelocityFlex))
                )*op_.rFlex * op_.positionControl;

        // Rotation sensor dynamic
        op_.imuOmega = op_.angularVelocityFlex + op_.rFlex * op_.angularVelocityControl;

        // Set sensor state before measurement

        op_.sensorState.resize(sensor_.getStateSize());
        op_.sensorState.head<9>() = Eigen::Map<Eigen::Matrix<double, 9, 1> >(&op_.rimu(0,0));
        op_.sensorState.segment<3>(9)=op_.imuAcc;
        op_.sensorState.segment<3>(12)=op_.imuOmega;

        index_=15;

        if (withForceMeasurements_)
        {
          for (unsigned int i=0; i<nbContacts_; ++i)
          {
            op_.sensorState.segment(index_,6) = x.segment(state::fc+i*6,6);
            // the last part of the measurement is force torque, it is
            // computes by the current functor and not the sensor_.
            // (see AlgebraicSensor::concatenateWithInput
            // for more details
            index_+=6;
          }
        }

        if (withAbsolutePos_)
        {
          op_.cy=cos(op_.drift(2));
          op_.sy=sin(op_.drift(2));
          op_.rdrift<< op_.cy, -op_.sy, 0,
                       op_.sy,  op_.cy, 0,
                       0,       0,      1;
          op_.rtotal.noalias() = op_.rdrift*op_.rFlex;

          op_.ptotal << op_.drift(0),op_.drift(1),0;
          op_.ptotal.noalias() += op_.rdrift*op_.positionFlex;

          op_.aatotal = op_.rtotal;
          op_.oritotal.noalias() = op_.aatotal.angle()*op_.aatotal.axis();

          op_.sensorState.segment<3>(index_) = op_.ptotal;
          op_.sensorState.segment<3>(index_+3) = op_.oritotal;
        }

        sensor_.setState(op_.sensorState,k);

        //measurements
        yk_=sensor_.getMeasurements();
        return yk_;
    }